

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O1

void Map_SuperTableResize(Map_HashTable_t *p)

{
  uint uVar1;
  Map_HashEntry_t **ppMVar2;
  ulong uVar3;
  uint uVar4;
  Map_HashEntry_t **__s;
  Map_HashEntry_t *pMVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Map_HashEntry_t *pMVar10;
  Map_HashEntry_t *pMVar11;
  
  uVar1 = p->nBins;
  uVar7 = uVar1 * 2 - 1;
  while( true ) {
    do {
      uVar8 = uVar7 + 1;
      uVar4 = uVar7 & 1;
      uVar7 = uVar8;
    } while (uVar4 != 0);
    if (uVar8 < 9) break;
    iVar6 = 5;
    while (uVar8 % (iVar6 - 2U) != 0) {
      uVar4 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar8 < uVar4) goto LAB_00406bb7;
    }
  }
LAB_00406bb7:
  __s = (Map_HashEntry_t **)malloc((long)(int)uVar8 << 3);
  iVar6 = 0;
  memset(__s,0,(long)(int)uVar8 << 3);
  if (0 < (int)uVar1) {
    ppMVar2 = p->pBins;
    uVar9 = 0;
    iVar6 = 0;
    do {
      pMVar11 = ppMVar2[uVar9];
      if (pMVar11 != (Map_HashEntry_t *)0x0) {
        pMVar5 = pMVar11->pNext;
        do {
          pMVar10 = pMVar5;
          uVar3 = (ulong)(pMVar11->uTruth[1] * 0x7d3 + pMVar11->uTruth[0]) % (ulong)uVar8;
          pMVar11->pNext = __s[uVar3];
          __s[uVar3] = pMVar11;
          if (pMVar10 == (Map_HashEntry_t *)0x0) {
            pMVar5 = (Map_HashEntry_t *)0x0;
          }
          else {
            pMVar5 = pMVar10->pNext;
          }
          iVar6 = iVar6 + 1;
          pMVar11 = pMVar10;
        } while (pMVar10 != (Map_HashEntry_t *)0x0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar1);
  }
  if (iVar6 == p->nEntries) {
    if (p->pBins != (Map_HashEntry_t **)0x0) {
      free(p->pBins);
      p->pBins = (Map_HashEntry_t **)0x0;
    }
    p->pBins = __s;
    p->nBins = uVar8;
    return;
  }
  __assert_fail("Counter == p->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperTable.c"
                ,0xff,"void Map_SuperTableResize(Map_HashTable_t *)");
}

Assistant:

void Map_SuperTableResize( Map_HashTable_t * p )
{
    Map_HashEntry_t ** pBinsNew;
    Map_HashEntry_t * pEnt, * pEnt2;
    int nBinsNew, Counter, i;
    unsigned Key;
    // get the new table size
    nBinsNew = Abc_PrimeCudd(2 * p->nBins); 
    // allocate a new array
    pBinsNew = ABC_ALLOC( Map_HashEntry_t *, nBinsNew );
    memset( pBinsNew, 0, sizeof(Map_HashEntry_t *) * nBinsNew );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i], pEnt2 = pEnt? pEnt->pNext: NULL; pEnt; 
              pEnt = pEnt2, pEnt2 = pEnt? pEnt->pNext: NULL )
        {
            Key = MAP_TABLE_HASH( pEnt->uTruth[0], pEnt->uTruth[1], nBinsNew );
            pEnt->pNext   = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == p->nEntries );
    // replace the table and the parameters
    ABC_FREE( p->pBins );
    p->pBins = pBinsNew;
    p->nBins = nBinsNew;
}